

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::
class_<VLEIsolineTracer<double>,_AbstractIsolineTracer<double>,_PyVLEIsolineTracer<double>_>::
class_<>(class_<VLEIsolineTracer<double>,_AbstractIsolineTracer<double>,_PyVLEIsolineTracer<double>_>
         *this,handle scope,char *name)

{
  mapped_type ptVar1;
  internals *this_00;
  mapped_type *pptVar2;
  internals *local_d0;
  type_index local_b0;
  type_index local_a8;
  internals *local_a0;
  type_map<type_info_*> *instances;
  undefined1 local_88 [8];
  type_record record;
  char *name_local;
  class_<VLEIsolineTracer<double>,_AbstractIsolineTracer<double>,_PyVLEIsolineTracer<double>_>
  *this_local;
  handle scope_local;
  
  record._96_8_ = name;
  detail::generic_type::generic_type(&this->super_generic_type);
  detail::type_record::type_record((type_record *)local_88);
  record.scope.m_ptr = (PyObject *)record._96_8_;
  record.name = (char *)&VLEIsolineTracer<double>::typeinfo;
  record.type = (type_info *)0x308;
  record.type_size = 8;
  record.type_align = 8;
  record.operator_new = init_instance;
  record.init_instance = dealloc;
  record.metaclass.m_ptr._0_1_ = (byte)record.metaclass.m_ptr | 8;
  local_88 = (undefined1  [8])scope.m_ptr;
  detail::set_operator_new<VLEIsolineTracer<double>>(local_88);
  add_base<AbstractIsolineTracer<double>,_0>((type_record *)local_88);
  instances._1_1_ = 0;
  add_base<PyVLEIsolineTracer<double>,_0>((type_record *)local_88);
  instances._2_1_ = 0;
  instances._3_1_ = 0;
  detail::process_attributes<>::init((EVP_PKEY_CTX *)local_88);
  detail::generic_type::initialize(&this->super_generic_type,(type_record *)local_88);
  if (((byte)record.metaclass.m_ptr >> 4 & 1) == 0) {
    local_d0 = detail::get_internals();
  }
  else {
    local_d0 = (internals *)detail::registered_local_types_cpp();
  }
  local_a0 = local_d0;
  std::type_index::type_index(&local_a8,(type_info *)&VLEIsolineTracer<double>::typeinfo);
  pptVar2 = std::
            unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
            ::operator[](&local_d0->registered_types_cpp,&local_a8);
  this_00 = local_a0;
  ptVar1 = *pptVar2;
  std::type_index::type_index(&local_b0,(type_info *)&PyVLEIsolineTracer<double>::typeinfo);
  pptVar2 = std::
            unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
            ::operator[](&this_00->registered_types_cpp,&local_b0);
  *pptVar2 = ptVar1;
  detail::type_record::~type_record((type_record *)local_88);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &... extra) {
        using namespace detail;

        // MI can only be specified via class_ template options, not constructor parameters
        static_assert(
            none_of<is_pyobject<Extra>...>::value || // no base class arguments, or:
            (   constexpr_sum(is_pyobject<Extra>::value...) == 1 && // Exactly one base
                constexpr_sum(is_base<options>::value...)   == 0 && // no template option bases
                none_of<std::is_same<multiple_inheritance, Extra>...>::value), // no multiple_inheritance attr
            "Error: multiple inheritance bases must be specified via class_ template options");

        type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(conditional_t<has_alias, type_alias, type>);
        record.type_align = alignof(conditional_t<has_alias, type_alias, type>&);
        record.holder_size = sizeof(holder_type);
        record.init_instance = init_instance;
        record.dealloc = dealloc;
        record.default_holder = detail::is_instantiation<std::unique_ptr, holder_type>::value;

        set_operator_new<type>(&record);

        /* Register base classes specified via template arguments to class_, if any */
        PYBIND11_EXPAND_SIDE_EFFECTS(add_base<options>(record));

        /* Process optional arguments, if any */
        process_attributes<Extra...>::init(extra..., &record);

        generic_type::initialize(record);

        if (has_alias) {
            auto &instances = record.module_local ? registered_local_types_cpp() : get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))] = instances[std::type_index(typeid(type))];
        }
    }